

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O3

DdNode * cuddZddIsop(DdManager *dd,DdNode *L,DdNode *U,DdNode **zdd_I)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  uint *puVar8;
  DdNode *pDVar9;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  DdNode *pDVar10;
  uint *puVar11;
  DdNode *U_00;
  uint index;
  DdNode *pDVar12;
  DdNode *pDVar13;
  DdNode *zdd_Id;
  DdNode *zdd_Isub1;
  DdNode *zdd_Isub0;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar10 = dd->one;
  pDVar5 = dd->zero;
  pDVar13 = (DdNode *)((ulong)pDVar10 ^ 1);
  if (pDVar13 == L) {
    *zdd_I = pDVar5;
    return pDVar13;
  }
  if (pDVar10 == U) {
    *zdd_I = pDVar10;
    return pDVar10;
  }
  if ((pDVar10 == L) || (pDVar13 == U)) {
    puts("*** ERROR : illegal condition for ISOP (U < L).");
    exit(1);
  }
  pDVar6 = cuddCacheLookup2(dd,cuddBddIsop,L,U);
  if (pDVar6 != (DdNode *)0x0) {
    pDVar7 = cuddCacheLookup2Zdd(dd,cuddZddIsop,L,U);
    *zdd_I = pDVar7;
    if (pDVar7 != (DdNode *)0x0) {
      return pDVar6;
    }
    piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar6);
  }
  puVar11 = (uint *)((ulong)L & 0xfffffffffffffffe);
  uVar2 = *puVar11;
  iVar3 = dd->perm[uVar2];
  puVar8 = (uint *)((ulong)U & 0xfffffffffffffffe);
  iVar4 = dd->perm[*puVar8];
  pDVar7 = L;
  pDVar6 = L;
  index = *puVar8;
  if (iVar3 <= iVar4) {
    pDVar6 = *(DdNode **)(puVar11 + 4);
    pDVar7 = *(DdNode **)(puVar11 + 6);
    index = uVar2;
    if (((ulong)L & 1) != 0) {
      pDVar6 = (DdNode *)((ulong)pDVar6 ^ 1);
      pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
    }
  }
  U_00 = U;
  pDVar12 = U;
  if (iVar4 <= iVar3) {
    pDVar12 = *(DdNode **)(puVar8 + 4);
    U_00 = *(DdNode **)(puVar8 + 6);
    if (((ulong)U & 1) != 0) {
      pDVar12 = (DdNode *)((ulong)pDVar12 ^ 1);
      U_00 = (DdNode *)((ulong)U_00 ^ 1);
    }
  }
  pDVar9 = cuddBddAndRecur(dd,pDVar7,(DdNode *)((ulong)pDVar12 ^ 1));
  if (pDVar9 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(pDVar9);
  n = cuddBddAndRecur(dd,pDVar6,(DdNode *)((ulong)U_00 ^ 1));
  if (n == (DdNode *)0x0) goto LAB_007a9860;
  Cudd_Ref(n);
  n_00 = cuddZddIsop(dd,pDVar9,U_00,&local_38);
  if (n_00 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar9);
    pDVar9 = n;
    goto LAB_007a9860;
  }
  Cudd_Ref(n_00);
  Cudd_Ref(local_38);
  n_01 = cuddZddIsop(dd,n,pDVar12,&local_40);
  if (n_01 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,pDVar9);
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,n_00);
    local_48 = local_38;
LAB_007a978c:
    Cudd_RecursiveDerefZdd(dd,local_48);
    return (DdNode *)0x0;
  }
  Cudd_Ref(n_01);
  Cudd_Ref(local_40);
  Cudd_RecursiveDeref(dd,pDVar9);
  Cudd_RecursiveDeref(dd,n);
  pDVar9 = cuddBddAndRecur(dd,pDVar7,(DdNode *)((ulong)n_00 ^ 1));
  if (pDVar9 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDerefZdd(dd,local_38);
    Cudd_RecursiveDeref(dd,n_01);
    local_48 = local_40;
    goto LAB_007a978c;
  }
  Cudd_Ref(pDVar9);
  pDVar6 = cuddBddAndRecur(dd,pDVar6,(DdNode *)((ulong)n_01 ^ 1));
  if (pDVar6 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDerefZdd(dd,local_38);
    Cudd_RecursiveDeref(dd,n_01);
    Cudd_RecursiveDerefZdd(dd,local_40);
    goto LAB_007a9860;
  }
  Cudd_Ref(pDVar6);
  pDVar7 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar9 ^ 1),(DdNode *)((ulong)pDVar6 ^ 1));
  if (pDVar7 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDerefZdd(dd,local_38);
    Cudd_RecursiveDeref(dd,n_01);
    local_48 = local_40;
    pDVar7 = pDVar6;
    pDVar6 = pDVar9;
LAB_007a9802:
    Cudd_RecursiveDerefZdd(dd,local_48);
  }
  else {
    pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
    Cudd_Ref(pDVar7);
    pDVar12 = cuddBddAndRecur(dd,U_00,pDVar12);
    if (pDVar12 != (DdNode *)0x0) {
      Cudd_Ref(pDVar12);
      Cudd_RecursiveDeref(dd,pDVar9);
      Cudd_RecursiveDeref(dd,pDVar6);
      pDVar6 = cuddZddIsop(dd,pDVar7,pDVar12,&local_48);
      if (pDVar6 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n_00);
        Cudd_RecursiveDerefZdd(dd,local_38);
        Cudd_RecursiveDeref(dd,n_01);
        Cudd_RecursiveDerefZdd(dd,local_40);
        Cudd_RecursiveDeref(dd,pDVar7);
        pDVar9 = pDVar12;
        goto LAB_007a9860;
      }
      Cudd_Ref(pDVar6);
      Cudd_Ref(local_48);
      Cudd_RecursiveDeref(dd,pDVar7);
      Cudd_RecursiveDeref(dd,pDVar12);
      pDVar10 = cuddUniqueInter(dd,index,pDVar10,pDVar13);
      if (pDVar10 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n_00);
        Cudd_RecursiveDerefZdd(dd,local_38);
        Cudd_RecursiveDeref(dd,n_01);
        Cudd_RecursiveDerefZdd(dd,local_40);
        Cudd_RecursiveDeref(dd,pDVar6);
        goto LAB_007a978c;
      }
      Cudd_Ref(pDVar10);
      pDVar9 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar10 ^ 1),n_00);
      if (pDVar9 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n_00);
        Cudd_RecursiveDerefZdd(dd,local_38);
        Cudd_RecursiveDeref(dd,n_01);
        Cudd_RecursiveDerefZdd(dd,local_40);
      }
      else {
        Cudd_Ref(pDVar9);
        Cudd_RecursiveDeref(dd,n_00);
        pDVar7 = cuddBddAndRecur(dd,pDVar10,n_01);
        if (pDVar7 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,local_38);
          Cudd_RecursiveDeref(dd,n_01);
          Cudd_RecursiveDerefZdd(dd,local_40);
          Cudd_RecursiveDeref(dd,pDVar6);
          Cudd_RecursiveDerefZdd(dd,local_48);
          Cudd_RecursiveDeref(dd,pDVar10);
          goto LAB_007a9860;
        }
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(dd,pDVar10);
        Cudd_RecursiveDeref(dd,n_01);
        pDVar13 = cuddBddAndRecur(dd,(DdNode *)((ulong)pDVar9 ^ 1),(DdNode *)((ulong)pDVar7 ^ 1));
        if (pDVar13 == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,local_38);
          Cudd_RecursiveDerefZdd(dd,local_40);
          Cudd_RecursiveDeref(dd,pDVar6);
          pDVar6 = pDVar9;
          goto LAB_007a9802;
        }
        pDVar10 = (DdNode *)((ulong)pDVar13 ^ 1);
        Cudd_Ref(pDVar10);
        Cudd_RecursiveDeref(dd,pDVar9);
        Cudd_RecursiveDeref(dd,pDVar7);
        pDVar9 = cuddBddAndRecur(dd,pDVar13,(DdNode *)((ulong)pDVar6 ^ 1));
        if (pDVar9 != (DdNode *)(ulong)(pDVar9 != (DdNode *)0x0)) {
          pDVar9 = (DdNode *)((ulong)(pDVar9 != (DdNode *)0x0) ^ (ulong)pDVar9);
          Cudd_Ref(pDVar9);
          Cudd_RecursiveDeref(dd,pDVar10);
          Cudd_RecursiveDeref(dd,pDVar6);
          pDVar10 = local_48;
          if ((local_38 == pDVar5) ||
             (pDVar10 = cuddZddGetNodeIVO(dd,index * 2 + 1,local_38,local_48),
             pDVar10 != (DdNode *)0x0)) {
            Cudd_Ref(pDVar10);
            pDVar13 = pDVar10;
            if ((local_40 == pDVar5) ||
               (pDVar13 = cuddZddGetNodeIVO(dd,index * 2,local_40,pDVar10), pDVar13 != (DdNode *)0x0
               )) {
              Cudd_Ref(pDVar13);
              Cudd_RecursiveDerefZdd(dd,local_38);
              Cudd_RecursiveDerefZdd(dd,local_40);
              Cudd_RecursiveDerefZdd(dd,local_48);
              Cudd_RecursiveDerefZdd(dd,pDVar10);
              cuddCacheInsert2(dd,cuddBddIsop,L,U,pDVar9);
              cuddCacheInsert2(dd,cuddZddIsop,L,U,pDVar13);
              Cudd_Deref(pDVar9);
              Cudd_Deref(pDVar13);
              *zdd_I = pDVar13;
              return pDVar9;
            }
            Cudd_RecursiveDerefZdd(dd,local_38);
            Cudd_RecursiveDerefZdd(dd,local_40);
            Cudd_RecursiveDerefZdd(dd,local_48);
            Cudd_RecursiveDeref(dd,pDVar9);
            local_48 = pDVar10;
            goto LAB_007a978c;
          }
          Cudd_RecursiveDerefZdd(dd,local_38);
          Cudd_RecursiveDerefZdd(dd,local_40);
          Cudd_RecursiveDerefZdd(dd,local_48);
          goto LAB_007a9860;
        }
        Cudd_RecursiveDerefZdd(dd,local_38);
        Cudd_RecursiveDerefZdd(dd,local_40);
      }
      Cudd_RecursiveDeref(dd,pDVar6);
      Cudd_RecursiveDerefZdd(dd,local_48);
      pDVar9 = pDVar10;
      goto LAB_007a9860;
    }
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDerefZdd(dd,local_38);
    Cudd_RecursiveDeref(dd,n_01);
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDeref(dd,pDVar9);
  }
  Cudd_RecursiveDeref(dd,pDVar6);
  pDVar9 = pDVar7;
LAB_007a9860:
  Cudd_RecursiveDeref(dd,pDVar9);
  return (DdNode *)0x0;
}

Assistant:

DdNode  *
cuddZddIsop(
  DdManager * dd,
  DdNode * L,
  DdNode * U,
  DdNode ** zdd_I)
{
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = Cudd_Not(one);
    DdNode      *zdd_one = DD_ONE(dd);
    DdNode      *zdd_zero = DD_ZERO(dd);
    int         v, top_l, top_u;
    DdNode      *Lsub0, *Usub0, *Lsub1, *Usub1, *Ld, *Ud;
    DdNode      *Lsuper0, *Usuper0, *Lsuper1, *Usuper1;
    DdNode      *Isub0, *Isub1, *Id;
    DdNode      *zdd_Isub0, *zdd_Isub1, *zdd_Id;
    DdNode      *x;
    DdNode      *term0, *term1, *sum;
    DdNode      *Lv, *Uv, *Lnv, *Unv;
    DdNode      *r, *y, *z;
    int         index;
    DD_CTFP     cacheOp;

    statLine(dd);
    if (L == zero) {
        *zdd_I = zdd_zero;
        return(zero);
    }
    if (U == one) {
        *zdd_I = zdd_one;
        return(one);
    }

    if (U == zero || L == one) {
        printf("*** ERROR : illegal condition for ISOP (U < L).\n");
        exit(1);
    }

    /* Check the cache. We store two results for each recursive call.
    ** One is the BDD, and the other is the ZDD. Both are needed.
    ** Hence we need a double hit in the cache to terminate the
    ** recursion. Clearly, collisions may evict only one of the two
    ** results. */
    cacheOp = (DD_CTFP) cuddZddIsop;
    r = cuddCacheLookup2(dd, cuddBddIsop, L, U);
    if (r) {
        *zdd_I = cuddCacheLookup2Zdd(dd, cacheOp, L, U);
        if (*zdd_I)
            return(r);
        else {
            /* The BDD result may have been dead. In that case
            ** cuddCacheLookup2 would have called cuddReclaim,
            ** whose effects we now have to undo. */
            cuddRef(r);
            Cudd_RecursiveDeref(dd, r);
        }
    }

    top_l = dd->perm[Cudd_Regular(L)->index];
    top_u = dd->perm[Cudd_Regular(U)->index];
    v = ddMin(top_l, top_u);

    /* Compute cofactors. */
    if (top_l == v) {
        index = Cudd_Regular(L)->index;
        Lv = Cudd_T(L);
        Lnv = Cudd_E(L);
        if (Cudd_IsComplement(L)) {
            Lv = Cudd_Not(Lv);
            Lnv = Cudd_Not(Lnv);
        }
    }
    else {
        index = Cudd_Regular(U)->index;
        Lv = Lnv = L;
    }

    if (top_u == v) {
        Uv = Cudd_T(U);
        Unv = Cudd_E(U);
        if (Cudd_IsComplement(U)) {
            Uv = Cudd_Not(Uv);
            Unv = Cudd_Not(Unv);
        }
    }
    else {
        Uv = Unv = U;
    }

    Lsub0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Uv));
    if (Lsub0 == NULL)
        return(NULL);
    Cudd_Ref(Lsub0);
    Usub0 = Unv;
    Lsub1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Unv));
    if (Lsub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        return(NULL);
    }
    Cudd_Ref(Lsub1);
    Usub1 = Uv;

    Isub0 = cuddZddIsop(dd, Lsub0, Usub0, &zdd_Isub0);
    if (Isub0 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        return(NULL);
    }
    /*
    if ((!cuddIsConstant(Cudd_Regular(Isub0))) &&
        (Cudd_Regular(Isub0)->index != zdd_Isub0->index / 2 ||
        dd->permZ[index * 2] > dd->permZ[zdd_Isub0->index])) {
        printf("*** ERROR : illegal permutation in ZDD. ***\n");
    }
    */
    Cudd_Ref(Isub0);
    Cudd_Ref(zdd_Isub0);
    Isub1 = cuddZddIsop(dd, Lsub1, Usub1, &zdd_Isub1);
    if (Isub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        return(NULL);
    }
    /*
    if ((!cuddIsConstant(Cudd_Regular(Isub1))) &&
        (Cudd_Regular(Isub1)->index != zdd_Isub1->index / 2 ||
        dd->permZ[index * 2] > dd->permZ[zdd_Isub1->index])) {
        printf("*** ERROR : illegal permutation in ZDD. ***\n");
    }
    */
    Cudd_Ref(Isub1);
    Cudd_Ref(zdd_Isub1);
    Cudd_RecursiveDeref(dd, Lsub0);
    Cudd_RecursiveDeref(dd, Lsub1);

    Lsuper0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Isub0));
    if (Lsuper0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        return(NULL);
    }
    Cudd_Ref(Lsuper0);
    Lsuper1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Isub1));
    if (Lsuper1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        return(NULL);
    }
    Cudd_Ref(Lsuper1);
    Usuper0 = Unv;
    Usuper1 = Uv;

    /* Ld = Lsuper0 + Lsuper1 */
    Ld = cuddBddAndRecur(dd, Cudd_Not(Lsuper0), Cudd_Not(Lsuper1));
    if (Ld == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        return(NULL);
    }
    Ld = Cudd_Not(Ld);
    Cudd_Ref(Ld);
    /* Ud = Usuper0 * Usuper1 */
    Ud = cuddBddAndRecur(dd, Usuper0, Usuper1);
    if (Ud == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        Cudd_RecursiveDeref(dd, Ld);
        return(NULL);
    }
    Cudd_Ref(Ud);
    Cudd_RecursiveDeref(dd, Lsuper0);
    Cudd_RecursiveDeref(dd, Lsuper1);

    Id = cuddZddIsop(dd, Ld, Ud, &zdd_Id);
    if (Id == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Ld);
        Cudd_RecursiveDeref(dd, Ud);
        return(NULL);
    }
    /*
    if ((!cuddIsConstant(Cudd_Regular(Id))) &&
        (Cudd_Regular(Id)->index != zdd_Id->index / 2 ||
        dd->permZ[index * 2] > dd->permZ[zdd_Id->index])) {
        printf("*** ERROR : illegal permutation in ZDD. ***\n");
    }
    */
    Cudd_Ref(Id);
    Cudd_Ref(zdd_Id);
    Cudd_RecursiveDeref(dd, Ld);
    Cudd_RecursiveDeref(dd, Ud);

    x = cuddUniqueInter(dd, index, one, zero);
    if (x == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        return(NULL);
    }
    Cudd_Ref(x);
    /* term0 = x * Isub0 */
    term0 = cuddBddAndRecur(dd, Cudd_Not(x), Isub0);
    if (term0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        Cudd_RecursiveDeref(dd, x);
        return(NULL);
    }
    Cudd_Ref(term0);
    Cudd_RecursiveDeref(dd, Isub0);
    /* term1 = x * Isub1 */
    term1 = cuddBddAndRecur(dd, x, Isub1);
    if (term1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        Cudd_RecursiveDeref(dd, x);
        Cudd_RecursiveDeref(dd, term0);
        return(NULL);
    }
    Cudd_Ref(term1);
    Cudd_RecursiveDeref(dd, x);
    Cudd_RecursiveDeref(dd, Isub1);
    /* sum = term0 + term1 */
    sum = cuddBddAndRecur(dd, Cudd_Not(term0), Cudd_Not(term1));
    if (sum == NULL) {
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        Cudd_RecursiveDeref(dd, term0);
        Cudd_RecursiveDeref(dd, term1);
        return(NULL);
    }
    sum = Cudd_Not(sum);
    Cudd_Ref(sum);
    Cudd_RecursiveDeref(dd, term0);
    Cudd_RecursiveDeref(dd, term1);
    /* r = sum + Id */
    r = cuddBddAndRecur(dd, Cudd_Not(sum), Cudd_Not(Id));
    r = Cudd_NotCond(r, r != NULL);
    if (r == NULL) {
        Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
        Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDerefZdd(dd, zdd_Id);
        Cudd_RecursiveDeref(dd, sum);
        return(NULL);
    }
    Cudd_Ref(r);
    Cudd_RecursiveDeref(dd, sum);
    Cudd_RecursiveDeref(dd, Id);

    if (zdd_Isub0 != zdd_zero) {
        z = cuddZddGetNodeIVO(dd, index * 2 + 1, zdd_Isub0, zdd_Id);
        if (z == NULL) {
            Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
            Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
            Cudd_RecursiveDerefZdd(dd, zdd_Id);
            Cudd_RecursiveDeref(dd, r);
            return(NULL);
        }
    }
    else {
        z = zdd_Id;
    }
    Cudd_Ref(z);
    if (zdd_Isub1 != zdd_zero) {
        y = cuddZddGetNodeIVO(dd, index * 2, zdd_Isub1, z);
        if (y == NULL) {
            Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
            Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
            Cudd_RecursiveDerefZdd(dd, zdd_Id);
            Cudd_RecursiveDeref(dd, r);
            Cudd_RecursiveDerefZdd(dd, z);
            return(NULL);
        }
    }
    else
        y = z;
    Cudd_Ref(y);

    Cudd_RecursiveDerefZdd(dd, zdd_Isub0);
    Cudd_RecursiveDerefZdd(dd, zdd_Isub1);
    Cudd_RecursiveDerefZdd(dd, zdd_Id);
    Cudd_RecursiveDerefZdd(dd, z);

    cuddCacheInsert2(dd, cuddBddIsop, L, U, r);
    cuddCacheInsert2(dd, cacheOp, L, U, y);

    Cudd_Deref(r);
    Cudd_Deref(y);
    *zdd_I = y;
    /*
    if (Cudd_Regular(r)->index != y->index / 2) {
        printf("*** ERROR : mismatch in indices between BDD and ZDD. ***\n");
    }
    */
    return(r);

}